

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O1

void __thiscall QDial::mouseMoveEvent(QDial *this,QMouseEvent *e)

{
  QDialPrivate *this_00;
  undefined4 uVar1;
  uint uVar2;
  int position;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar6 [16];
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)e[0x44] & 1) == 0) {
    e[0xc] = (QMouseEvent)0x0;
  }
  else {
    this_00 = *(QDialPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
    e[0xc] = (QMouseEvent)0x1;
    this_00->field_0x298 = this_00->field_0x298 | 4;
    uVar1 = QEventPoint::position();
    auVar6._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar6._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar6 = minpd(_DAT_0066f5d0,auVar6);
    auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
    auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
    uVar2 = movmskpd(uVar1,auVar5);
    uVar4 = 0x8000000000000000;
    if ((uVar2 & 1) != 0) {
      uVar4 = (ulong)(uint)(int)auVar6._0_8_ << 0x20;
    }
    uVar3 = 0x80000000;
    if ((uVar2 & 2) != 0) {
      uVar3 = (ulong)(uint)(int)auVar6._8_8_;
    }
    local_20 = (QPoint)(uVar3 | uVar4);
    position = QDialPrivate::valueFromPoint(this_00,&local_20);
    QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,position);
    this_00->field_0x298 = this_00->field_0x298 & 0xfb;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QDial);
    if (!(e->buttons() & Qt::LeftButton)) {
        e->ignore();
        return;
    }
    e->accept();
    d->doNotEmit = true;
    setSliderPosition(d->valueFromPoint(e->position().toPoint()));
    d->doNotEmit = false;
}